

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O3

void av1_filter_block_plane_vert_opt_chroma
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,int plane,
               _Bool joint_filter_chroma,int num_mis_in_lpf_unit_height_log2)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  undefined1 use_filter_type;
  uint uVar3;
  uint uVar4;
  aom_bit_depth_t bd;
  MB_MODE_INFO *pMVar5;
  MB_MODE_INFO **ppMVar6;
  loop_filter_thresh *_blimit0;
  bool bVar7;
  uint16_t *s;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  loop_filter_info_n *lfi_n;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  byte *pbVar22;
  uint8_t *puVar23;
  long lVar24;
  uint16_t *s_00;
  byte bVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  AV1_DEBLOCKING_PARAMETERS *pAVar29;
  uint uVar30;
  uint8_t *dst_ptr;
  uint8_t *puVar31;
  MB_MODE_INFO *pMVar32;
  byte bVar33;
  int iVar34;
  
  uVar3 = plane_ptr->subsampling_x;
  uVar4 = plane_ptr->subsampling_y;
  bVar15 = (byte)uVar3;
  bVar16 = (byte)uVar4;
  iVar21 = (((1 << (bVar16 & 0x1f)) >> 1) + (((plane_ptr->dst).height << (bVar16 & 0x1f)) + 3 >> 2)
           >> (bVar16 & 0x1f)) - (mi_row >> (bVar16 & 0x1f));
  iVar34 = (1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f)) >> (bVar16 & 0x1f);
  if (iVar21 < iVar34) {
    iVar34 = iVar21;
  }
  uVar28 = (((1 << (bVar15 & 0x1f)) >> 1) + (((plane_ptr->dst).width << (bVar15 & 0x1f)) + 3 >> 2)
           >> (bVar15 & 0x1f)) - (mi_col >> (bVar15 & 0x1f));
  uVar10 = 0x20 >> (bVar15 & 0x1f);
  if ((int)uVar28 < (int)uVar10) {
    uVar10 = uVar28;
  }
  if (0 < iVar34) {
    lVar13 = -1L << (bVar15 & 0x3f);
    iVar21 = (plane_ptr->dst).stride;
    lVar24 = (long)iVar21;
    uVar26 = (uVar10 << (bVar15 & 0x1f)) + mi_col;
    uVar27 = uVar3 | mi_col;
    lfi_n = &cm->lf_info;
    uVar28 = 0;
    do {
      params_buf->filter_length = '\0';
      uVar18 = (uVar28 << (bVar16 & 0x1f)) + mi_row | uVar4;
      ppMVar6 = (cm->mi_params).mi_grid_base +
                (ulong)((cm->mi_params).mi_stride * uVar18) + (ulong)uVar27;
      pMVar5 = *ppMVar6;
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0)) {
        if (plane == 0) {
          bVar33 = pMVar5->tx_size;
          if ((((pMVar5->field_0xa7 & 0x80) != 0) || ('\0' < pMVar5->ref_frame[0])) &&
             (pMVar5->skip_txfm == '\0')) {
            uVar14 = (ulong)pMVar5->bsize;
            bVar33 = pMVar5->inter_tx_size
                     [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [uVar14] - 1 & uVar27) >>
                      (av1_get_txb_size_index_tw_w_log2_table[uVar14] & 0x1f)) +
                      (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [uVar14] - 1 & uVar18) >>
                       (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar14) & 0x1f))
                      << (av1_get_txb_size_index_stride_log2_table[uVar14] & 0x1f))];
          }
        }
        else {
          bVar9 = ""[av1_ss_size_lookup[pMVar5->bsize][(int)uVar3][(int)uVar4]];
          if (bVar9 < 0x11) {
            bVar33 = 3;
            if ((1 < bVar9 - 0xb) && (bVar9 != 4)) {
              bVar33 = bVar9;
            }
          }
          else if (bVar9 == 0x11) {
            bVar33 = 9;
          }
          else {
            bVar33 = bVar9;
            if (bVar9 == 0x12) {
              bVar33 = 10;
            }
          }
        }
        *tx_buf = bVar33;
        if (mi_col != 0) {
          pMVar32 = ppMVar6[lVar13];
          if (xd != (MACROBLOCKD *)0x0) goto LAB_00b8a1eb;
LAB_00b8a20c:
          if (plane == 0) {
            bVar9 = pMVar32->tx_size;
            if ((((pMVar32->field_0xa7 & 0x80) != 0) || ('\0' < pMVar32->ref_frame[0])) &&
               (pMVar32->skip_txfm == '\0')) {
              uVar14 = (ulong)pMVar32->bsize;
              bVar9 = pMVar32->inter_tx_size
                      [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [uVar14] - 1 & (-1 << (bVar15 & 0x1f)) + uVar27) >>
                       (av1_get_txb_size_index_tw_w_log2_table[uVar14] & 0x1f)) +
                       (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [uVar14] - 1 & uVar18) >>
                        (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar14) & 0x1f))
                       << (av1_get_txb_size_index_stride_log2_table[uVar14] & 0x1f))];
            }
          }
          else {
            bVar9 = ""[av1_ss_size_lookup[pMVar32->bsize][(int)uVar3][(int)uVar4]];
            if (bVar9 < 0x11) {
              if ((bVar9 - 0xb < 2) || (bVar9 == 4)) {
                bVar9 = 3;
              }
            }
            else if (bVar9 == 0x11) {
              bVar9 = 9;
            }
            else if (bVar9 == 0x12) {
              bVar9 = 10;
            }
          }
          goto LAB_00b8a30b;
        }
LAB_00b8a273:
        iVar20 = 0x40;
        bVar25 = bVar33;
      }
      else {
        *tx_buf = '\0';
        if (mi_col == 0) {
          bVar33 = 0;
          goto LAB_00b8a273;
        }
        pMVar32 = ppMVar6[lVar13];
        bVar33 = 0;
LAB_00b8a1eb:
        if (xd->lossless[*(ushort *)&pMVar32->field_0xa7 & 7] == 0) goto LAB_00b8a20c;
        bVar9 = 0;
LAB_00b8a30b:
        iVar20 = tx_size_high[bVar9];
        bVar8 = get_filter_level(cm,lfi_n,0,plane,pMVar5);
        if (bVar8 == 0) {
          bVar8 = get_filter_level(cm,lfi_n,0,plane,pMVar32);
        }
        bVar7 = true;
        if ((pMVar32 == pMVar5) && (pMVar5->skip_txfm != '\0')) {
          if ((pMVar5->field_0xa7 & 0x80) == 0) {
            bVar7 = pMVar5->ref_frame[0] < '\x01';
          }
          else {
            bVar7 = false;
          }
        }
        bVar25 = bVar33;
        if ((!(bool)(pMVar32 == pMVar5 & (bVar7 ^ 1U))) && (bVar8 != 0)) {
          params_buf->filter_length = (uint8_t)vert_filter_length_chroma[bVar33][bVar9];
          params_buf->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar8 * 0x30);
          bVar25 = *tx_buf;
        }
      }
      iVar12 = tx_size_high[bVar33];
      if (iVar20 < tx_size_high[bVar33]) {
        iVar12 = iVar20;
      }
      iVar20 = tx_size_wide_unit[bVar25];
      uVar30 = (iVar20 << (bVar15 & 0x1f)) + mi_col;
      if (uVar30 < uVar26) {
        pbVar22 = tx_buf + iVar20;
        pAVar29 = params_buf + iVar20;
        do {
          pAVar29->filter_length = '\0';
          uVar11 = uVar3 | uVar30;
          uVar19 = (cm->mi_params).mi_stride * uVar18;
          ppMVar6 = (cm->mi_params).mi_grid_base;
          pMVar5 = ppMVar6[(ulong)uVar19 + (ulong)uVar11];
          if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0))
          {
            if (plane == 0) {
              bVar33 = pMVar5->tx_size;
              if ((((pMVar5->field_0xa7 & 0x80) != 0) || ('\0' < pMVar5->ref_frame[0])) &&
                 (pMVar5->skip_txfm == '\0')) {
                uVar14 = (ulong)pMVar5->bsize;
                bVar33 = pMVar5->inter_tx_size
                         [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [uVar14] - 1 & uVar11) >>
                          (av1_get_txb_size_index_tw_w_log2_table[uVar14] & 0x1f)) +
                          (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                  [uVar14] - 1 & uVar18) >>
                           (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar14) & 0x1f
                           )) << (av1_get_txb_size_index_stride_log2_table[uVar14] & 0x1f))];
              }
            }
            else {
              bVar9 = ""[av1_ss_size_lookup[pMVar5->bsize][(int)uVar3][(int)uVar4]];
              if (bVar9 < 0x11) {
                bVar33 = 3;
                if ((1 < bVar9 - 0xb) && (bVar9 != 4)) {
                  bVar33 = bVar9;
                }
              }
              else if (bVar9 == 0x11) {
                bVar33 = 9;
              }
              else {
                bVar33 = bVar9;
                if (bVar9 == 0x12) {
                  bVar33 = 10;
                }
              }
            }
          }
          else {
            bVar33 = 0;
          }
          *pbVar22 = bVar33;
          pMVar32 = ppMVar6[(ulong)uVar19 + (ulong)uVar11 + lVar13];
          bVar9 = get_filter_level(cm,lfi_n,0,plane,pMVar5);
          if (bVar9 == 0) {
            bVar9 = get_filter_level(cm,lfi_n,0,plane,pMVar32);
          }
          bVar7 = true;
          if ((pMVar32 == pMVar5) && (pMVar5->skip_txfm != '\0')) {
            if ((pMVar5->field_0xa7 & 0x80) == 0) {
              bVar7 = pMVar5->ref_frame[0] < '\x01';
            }
            else {
              bVar7 = false;
            }
          }
          uVar17 = (ulong)bVar33;
          uVar14 = uVar17;
          if ((bool)(bVar9 != 0 & (pMVar32 != pMVar5 | bVar7))) {
            pAVar29->filter_length = (uint8_t)vert_filter_length_chroma[uVar17][bVar25];
            pAVar29->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar9 * 0x30);
            uVar14 = (ulong)*pbVar22;
            bVar33 = *pbVar22;
          }
          bVar25 = bVar33;
          if (tx_size_high[uVar17] <= iVar12) {
            iVar12 = tx_size_high[uVar17];
          }
          iVar20 = tx_size_wide_unit[uVar14];
          uVar30 = uVar30 + (iVar20 << (bVar15 & 0x1f));
          pbVar22 = pbVar22 + iVar20;
          pAVar29 = pAVar29 + iVar20;
        } while (uVar30 < uVar26);
      }
      if ((((uVar28 & 3) == 0) && ((int)(uVar28 | 3) < iVar34)) && (0xf < iVar12)) {
        uVar30 = 2;
        uVar18 = 3;
      }
      else {
        uVar30 = 0;
        uVar18 = 0;
        if ((uVar28 & 1) == 0) {
          uVar30 = (uint)(7 < iVar12 && (int)(uVar28 | 1) < iVar34);
          uVar18 = uVar30;
        }
      }
      if (0 < (int)uVar10) {
        iVar20 = 0;
        pAVar29 = params_buf;
        pbVar22 = tx_buf;
        do {
          if (*pbVar22 == 0xff) {
            pAVar29->filter_length = '\0';
            *pbVar22 = 0;
          }
          iVar12 = iVar21 * 4 * uVar28 + iVar20 * 4;
          puVar31 = (plane_ptr->dst).buf + iVar12;
          if (joint_filter_chroma) {
            _blimit0 = pAVar29->lfthr;
            puVar23 = plane_ptr[1].dst.buf + iVar12;
            if (cm->seq_params->use_highbitdepth == '\0') {
              uVar11 = pAVar29->filter_length - 4;
              uVar11 = uVar11 >> 1 | (uint)((uVar11 & 1) != 0) << 0x1f;
              if ((char)uVar30 == '\x01') {
                if (uVar11 == 1) {
                  puVar1 = _blimit0->lim;
                  puVar2 = _blimit0->hev_thr;
                  aom_lpf_vertical_6_dual_sse2
                            (puVar31,iVar21,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                  aom_lpf_vertical_6_dual_sse2
                            (puVar23,iVar21,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                }
                else if (uVar11 == 0) {
                  puVar1 = _blimit0->lim;
                  puVar2 = _blimit0->hev_thr;
                  aom_lpf_vertical_4_dual_sse2
                            (puVar31,iVar21,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                  aom_lpf_vertical_4_dual_sse2
                            (puVar23,iVar21,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,
                             puVar2);
                }
              }
              else if (uVar30 == 2) {
                if (uVar11 == 1) {
                  aom_lpf_vertical_6_quad_sse2
                            (puVar31,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                  aom_lpf_vertical_6_quad_sse2
                            (puVar23,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                }
                else if (uVar11 == 0) {
                  aom_lpf_vertical_4_quad_sse2
                            (puVar31,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                  aom_lpf_vertical_4_quad_sse2
                            (puVar23,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                }
              }
              else if (uVar11 == 1) {
                aom_lpf_vertical_6_sse2
                          (puVar31,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                aom_lpf_vertical_6_sse2
                          (puVar23,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              }
              else if (uVar11 == 0) {
                aom_lpf_vertical_4_sse2
                          (puVar31,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
                aom_lpf_vertical_4_sse2
                          (puVar23,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              }
            }
            else {
              bd = cm->seq_params->bit_depth;
              s = (uint16_t *)((long)puVar31 * 2);
              s_00 = (uint16_t *)((long)puVar23 * 2);
              uVar11 = pAVar29->filter_length - 4;
              uVar11 = uVar11 >> 1 | (uint)((uVar11 & 1) != 0) << 0x1f;
              if ((char)uVar30 == '\x01') {
                if (uVar11 == 1) {
                  aom_highbd_lpf_vertical_6_dual_sse2
                            (s,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
LAB_00b8ac25:
                  aom_highbd_lpf_vertical_6_dual_sse2
                            (s_00,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                }
                else if (uVar11 == 0) {
                  (*aom_highbd_lpf_vertical_4_dual)
                            (s,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
LAB_00b8a9c4:
                  (*aom_highbd_lpf_vertical_4_dual)
                            (s_00,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,
                             _blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                }
              }
              else if (uVar30 == 2) {
                if (uVar11 == 1) {
                  puVar31 = _blimit0->lim;
                  puVar23 = _blimit0->hev_thr;
                  aom_highbd_lpf_vertical_6_dual_sse2
                            (s,iVar21,_blimit0->mblim,puVar31,puVar23,_blimit0->mblim,puVar31,
                             puVar23,bd);
                  aom_highbd_lpf_vertical_6_dual_sse2
                            (s + lVar24 * 8,iVar21,_blimit0->mblim,puVar31,puVar23,_blimit0->mblim,
                             puVar31,puVar23,bd);
                  aom_highbd_lpf_vertical_6_dual_sse2
                            (s_00,iVar21,_blimit0->mblim,puVar31,puVar23,_blimit0->mblim,puVar31,
                             puVar23,bd);
                  s_00 = s_00 + lVar24 * 8;
                  goto LAB_00b8ac25;
                }
                if (uVar11 == 0) {
                  puVar31 = _blimit0->lim;
                  puVar23 = _blimit0->hev_thr;
                  (*aom_highbd_lpf_vertical_4_dual)
                            (s,iVar21,_blimit0->mblim,puVar31,puVar23,_blimit0->mblim,puVar31,
                             puVar23,bd);
                  (*aom_highbd_lpf_vertical_4_dual)
                            (s + lVar24 * 8,iVar21,_blimit0->mblim,puVar31,puVar23,_blimit0->mblim,
                             puVar31,puVar23,bd);
                  (*aom_highbd_lpf_vertical_4_dual)
                            (s_00,iVar21,_blimit0->mblim,puVar31,puVar23,_blimit0->mblim,puVar31,
                             puVar23,bd);
                  s_00 = s_00 + lVar24 * 8;
                  goto LAB_00b8a9c4;
                }
              }
              else if (uVar11 == 1) {
                aom_highbd_lpf_vertical_6_sse2
                          (s,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                aom_highbd_lpf_vertical_6_sse2
                          (s_00,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
              }
              else if (uVar11 == 0) {
                aom_highbd_lpf_vertical_4_sse2
                          (s,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
                aom_highbd_lpf_vertical_4_sse2
                          (s_00,iVar21,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
              }
            }
          }
          else {
            use_filter_type = cm->seq_params->use_highbitdepth;
            filter_vert(puVar31,iVar21,pAVar29,(SequenceHeader *)(ulong)cm->seq_params->bit_depth,
                        use_filter_type);
          }
          uVar11 = tx_size_wide_unit[*pbVar22];
          iVar20 = iVar20 + uVar11;
          pbVar22 = pbVar22 + uVar11;
          pAVar29 = pAVar29 + uVar11;
        } while (iVar20 < (int)uVar10);
      }
      uVar28 = uVar28 + uVar18 + 1;
    } while ((int)uVar28 < iVar34);
  }
  return;
}

Assistant:

void av1_filter_block_plane_vert_opt_chroma(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int plane, bool joint_filter_chroma,
    int num_mis_in_lpf_unit_height_log2) {
  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int mi_cols =
      ((plane_ptr->dst.width << scale_horz) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int mi_rows =
      ((plane_ptr->dst.height << scale_vert) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int plane_mi_rows = ROUND_POWER_OF_TWO(mi_rows, scale_vert);
  const int plane_mi_cols = ROUND_POWER_OF_TWO(mi_cols, scale_horz);
  const int y_range =
      AOMMIN((int)(plane_mi_rows - (mi_row >> scale_vert)),
             ((1 << num_mis_in_lpf_unit_height_log2) >> scale_vert));
  const int x_range = AOMMIN((int)(plane_mi_cols - (mi_col >> scale_horz)),
                             (MAX_MIB_SIZE >> scale_horz));
  const ptrdiff_t mode_step = (ptrdiff_t)1 << scale_horz;

  for (int y = 0; y < y_range; y++) {
    const uint32_t curr_y = mi_row + (y << scale_vert);
    const uint32_t x_start = mi_col + (0 << scale_horz);
    const uint32_t x_end = mi_col + (x_range << scale_horz);
    int min_height = tx_size_high[TX_64X64];
    set_lpf_parameters_for_line_chroma(params_buf, tx_buf, cm, xd, VERT_EDGE,
                                       x_start, curr_y, plane_ptr, x_end,
                                       mode_step, scale_horz, scale_vert,
                                       &min_height, plane, joint_filter_chroma);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    int use_filter_type = USE_SINGLE;
    int y_inc = 0;

    if ((y & 3) == 0 && (y + 3) < y_range && min_height >= 16) {
      // If we are on a row which is a multiple of 4, and the minimum height is
      // 16 pixels, then the current and below 3 rows must contain the same tx
      // block. This is because dim 16 can only happen every unit of 4 mi's.
      use_filter_type = USE_QUAD;
      y_inc = 3;
    } else if (y % 2 == 0 && (y + 1) < y_range && min_height >= 8) {
      // If we are on an even row, and the minimum height is 8 pixels, then the
      // current and below rows must contain the same tx block. This is because
      // dim 4 can only happen every unit of 2**0, and 8 every unit of 2**1,
      // etc.
      use_filter_type = USE_DUAL;
      y_inc = 1;
    }

    for (int x = 0; x < x_range;) {
      // inner loop always filter vertical edges in a MI block. If MI size
      // is 8x8, it will filter the vertical edge aligned with a 8x8 block.
      // If 4x4 transform is used, it will then filter the internal edge
      //  aligned with a 4x4 block
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      const int offset = y * MI_SIZE * dst_stride + x * MI_SIZE;
      if (joint_filter_chroma) {
        uint8_t *u_dst = plane_ptr[0].dst.buf + offset;
        uint8_t *v_dst = plane_ptr[1].dst.buf + offset;
        filter_vert_chroma(u_dst, v_dst, dst_stride, params, cm->seq_params,
                           use_filter_type);
      } else {
        uint8_t *dst_ptr = plane_ptr->dst.buf + offset;
        filter_vert(dst_ptr, dst_stride, params, cm->seq_params,
                    use_filter_type);
      }

      // advance the destination pointer
      const uint32_t advance_units = tx_size_wide_unit[*tx_size];
      x += advance_units;
      params += advance_units;
      tx_size += advance_units;
    }
    y += y_inc;
  }
}